

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

void duckdb_je_background_thread_postfork_parent(tsdn_t *tsdn)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (duckdb_je_max_background_threads != 0) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      duckdb_je_malloc_mutex_postfork_parent(tsdn,&duckdb_je_background_thread_info[uVar2].mtx);
      bVar1 = uVar3 < duckdb_je_max_background_threads;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  duckdb_je_malloc_mutex_postfork_parent(tsdn,&duckdb_je_background_thread_lock);
  return;
}

Assistant:

void
background_thread_postfork_parent(tsdn_t *tsdn) {
	for (unsigned i = 0; i < max_background_threads; i++) {
		malloc_mutex_postfork_parent(tsdn,
		    &background_thread_info[i].mtx);
	}
	malloc_mutex_postfork_parent(tsdn, &background_thread_lock);
}